

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModSqrt_test.cpp
# Opt level: O1

void __thiscall MOD_SQRT_SmallValues_Test::TestBody(MOD_SQRT_SmallValues_Test *this)

{
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  int iVar1;
  bool bVar2;
  int extraout_EAX;
  undefined1 auVar3 [8];
  char *message;
  int iVar4;
  undefined8 *puVar5;
  undefined4 uVar6;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 uVar7;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined1 local_b8 [8];
  vector<int,_std::allocator<int>_> primes;
  unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> sqrtable;
  pointer *local_58;
  AssertionResult gtest_ar;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  
  eratosthenes_sieve((vector<int,_std::allocator<int>_> *)local_b8,300);
  if (local_b8 !=
      (undefined1  [8])
      primes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start)
  {
    this_00 = &gtest_ar.message_;
    auVar3 = local_b8;
    do {
      iVar1 = *(int *)&((__node_base_ptr)auVar3)->_M_nxt;
      primes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)&sqrtable._M_h._M_rehash_policy._M_next_resize;
      sqrtable._M_h._M_buckets = (__buckets_ptr)0x1;
      uVar6 = 0;
      uVar7 = 0;
      sqrtable._M_h._M_bucket_count = 0;
      sqrtable._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      sqrtable._M_h._M_element_count._0_4_ = 0x3f800000;
      sqrtable._M_h._M_rehash_policy._M_max_load_factor = 0.0;
      sqrtable._M_h._M_rehash_policy._4_4_ = 0;
      sqrtable._M_h._M_rehash_policy._M_next_resize = 0;
      puVar5 = (undefined8 *)sqrtable._M_h._M_bucket_count;
      sqrtable._M_h._M_single_bucket = (__node_base_ptr)auVar3;
      if (0 < iVar1) {
        iVar4 = 0;
        do {
          local_38.ptr_._0_4_ = iVar4 * iVar4;
          local_58 = &primes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage;
          std::
          _Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::
          _M_insert<int,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<int,false>>>>
                    ((_Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                      *)local_58,&local_38,(internal *)&local_58);
          iVar4 = iVar4 + 1;
          puVar5 = (undefined8 *)sqrtable._M_h._M_bucket_count;
          uVar6 = extraout_XMM0_Da;
          uVar7 = extraout_XMM0_Db;
        } while (iVar1 != iVar4);
      }
      for (; puVar5 != (undefined8 *)0x0; puVar5 = (undefined8 *)*puVar5) {
        iVar4 = *(int *)(puVar5 + 1);
        sqrt((double)CONCAT44(uVar7,uVar6));
        local_38.ptr_._0_4_ = (int)((long)(ulong)(uint)(extraout_EAX * extraout_EAX) % (long)iVar1);
        gtest_ar.message_.ptr_._0_4_ = iVar4 % iVar1;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)&local_58,"(s*s)%p","a % p",(int *)&local_38,(int *)this_00);
        if (local_58._0_1_ == (internal)0x0) {
          testing::Message::Message((Message *)&local_38);
          message = "";
          if (gtest_ar._0_8_ != 0) {
            message = *(char **)gtest_ar._0_8_;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)this_00,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/trinerdi[P]icpc-notebook/src/kactl/number-theory/ModSqrt_test.cpp"
                     ,0xc,message);
          testing::internal::AssertHelper::operator=((AssertHelper *)this_00,(Message *)&local_38);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
          if (local_38.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            bVar2 = testing::internal::IsTrue(true);
            if ((bVar2) &&
               (local_38.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
              (**(code **)(*(long *)local_38.ptr_ + 8))();
            }
            local_38.ptr_ =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        uVar6 = extraout_XMM0_Da_00;
        uVar7 = extraout_XMM0_Db_00;
      }
      std::
      _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable((_Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     *)&primes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
      auVar3 = (undefined1  [8])((long)&(sqrtable._M_h._M_single_bucket)->_M_nxt + 4);
    } while (auVar3 != (undefined1  [8])
                       primes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start);
  }
  if (local_b8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_b8);
  }
  return;
}

Assistant:

TEST(MOD_SQRT, SmallValues) {
    auto primes = eratosthenes_sieve(300);
    for(int p : primes) {
        unordered_set<int> sqrtable;
        rep(a,0,p) sqrtable.insert(a*a);
        for(int a : sqrtable) {
            int s = sqrt(a, p);
            EXPECT_EQ((s*s)%p, a % p);
        }
    }
}